

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIBoolDecoder::decode(FIBoolDecoder *this,uint8_t *data,size_t len)

{
  byte bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  DeadlyImportError *this_00;
  long in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar3;
  long lVar4;
  shared_ptr<const_Assimp::FIValue> sVar5;
  undefined1 local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  vector<bool,_std::allocator<bool>_> value;
  
  if (in_RCX != 0) {
    value.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    value.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    value.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    value.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    value.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    bVar1 = *(byte *)len;
    uVar3 = (ulong)(bVar1 >> 4);
    std::vector<bool,_std::allocator<bool>_>::reserve(&value,(in_RCX * 8 - uVar3) - 4);
    for (lVar4 = uVar3 + in_RCX * -8 + 4; lVar4 != 0; lVar4 = lVar4 + 1) {
      std::vector<bool,_std::allocator<bool>_>::push_back(&value,(bool)((bVar1 & 8) >> 3));
    }
    FIBoolValue::create((vector<bool,_std::allocator<bool>_> *)local_58);
    _Var2._M_pi = _Stack_50._M_pi;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *this = (FIBoolDecoder)local_58;
    this[1] = (FIBoolDecoder)_Var2._M_pi;
    local_58 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&value.super__Bvector_base<std::allocator<bool>_>);
    sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<const_Assimp::FIValue>)
           sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len < 1) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<bool> value;
        uint8_t b = *data++;
        size_t unusedBits = b >> 4;
        size_t numBools = (len * 8) - 4 - unusedBits;
        value.reserve(numBools);
        uint8_t mask = 1 << 3;
        for (size_t i = 0; i < numBools; ++i) {
            if (!mask) {
                mask = 1 << 7;
                b = *data++;
            }
            value.push_back((b & mask) != 0);
        }
        return FIBoolValue::create(std::move(value));
    }